

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O0

void __thiscall
Imf_2_5::DwaCompressor::LossyDctEncoderBase::rleAc
          (LossyDctEncoderBase *this,half *block,unsigned_short **acPtr)

{
  unsigned_short *puVar1;
  undefined2 *puVar2;
  ushort *puVar3;
  unsigned_short uVar4;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  bool bVar5;
  int runLen;
  unsigned_short rleSymbol;
  int dctComp;
  int local_24;
  int local_1c;
  
  local_1c = 1;
  while (local_1c < 0x40) {
    local_24 = 1;
    uVar4 = ::half::bits((half *)(in_RSI + (long)local_1c * 2));
    if (uVar4 == 0) {
      while( true ) {
        bVar5 = false;
        if (local_1c + local_24 < 0x40) {
          uVar4 = ::half::bits((half *)(in_RSI + (long)(local_1c + local_24) * 2));
          bVar5 = uVar4 == 0;
        }
        if (!bVar5) break;
        local_24 = local_24 + 1;
      }
      if (local_24 == 1) {
        local_24 = 1;
        uVar4 = ::half::bits((half *)(in_RSI + (long)local_1c * 2));
        puVar1 = (unsigned_short *)*in_RDX;
        *in_RDX = (long)(puVar1 + 1);
        *puVar1 = uVar4;
        *(int *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) + 1;
      }
      else if (local_24 + local_1c == 0x40) {
        puVar2 = (undefined2 *)*in_RDX;
        *in_RDX = (long)(puVar2 + 1);
        *puVar2 = 0xff00;
        *(int *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) + 1;
      }
      else {
        puVar3 = (ushort *)*in_RDX;
        *in_RDX = (long)(puVar3 + 1);
        *puVar3 = (ushort)local_24 | 0xff00;
        *(int *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) + 1;
      }
      local_1c = local_24 + local_1c;
    }
    else {
      uVar4 = ::half::bits((half *)(in_RSI + (long)local_1c * 2));
      puVar1 = (unsigned_short *)*in_RDX;
      *in_RDX = (long)(puVar1 + 1);
      *puVar1 = uVar4;
      *(int *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) + 1;
      local_1c = local_1c + 1;
    }
  }
  return;
}

Assistant:

void
DwaCompressor::LossyDctEncoderBase::rleAc
    (half *block,
     unsigned short *&acPtr)
{
    int dctComp              = 1; 
    unsigned short rleSymbol = 0x0;

    while (dctComp < 64)
    {
        int runLen = 1;
    
        //
        // If we don't have a 0, output verbatim
        //

        if (block[dctComp].bits() != rleSymbol)
        {
            *acPtr++ =  block[dctComp].bits();
            _numAcComp++;

            dctComp += runLen;
            continue;
        }

        //
        // We're sitting on a 0, so see how big the run is.
        //

        while ((dctComp+runLen < 64) && 
               (block[dctComp+runLen].bits() == rleSymbol))
        {
            runLen++;
        }

        //
        // If the run len is too small, just output verbatim
        // otherwise output our run token
        //
        // Originally, we wouldn't have a separate symbol for
        // "end of block". But in some experimentation, it looks
        // like using 0xff00 for "end of block" can save a bit
        // of space. 
        //

        if (runLen == 1)
        {
            runLen           = 1;
            *acPtr++ = block[dctComp].bits();
            _numAcComp++;

            //
            // Using 0xff00 for "end of block"
            //
        }
        else if (runLen + dctComp == 64)
        {
            //
            // Signal EOB
            //

            *acPtr++ = 0xff00;
            _numAcComp++;
        }
        else
        {
            // 
            // Signal normal run
            //

            *acPtr++   = 0xff00 | runLen;
            _numAcComp++;
        }

        //
        // Advance by runLen
        //

        dctComp += runLen;
    }
}